

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::SkipMessage
               (CodedInputStream *input,CodedOutputStream *output)

{
  bool bVar1;
  WireType WVar2;
  CodedInputStream *in_RDI;
  WireType wire_type;
  uint32 tag;
  uint32 v;
  CodedInputStream *pCVar3;
  uint32 value;
  uint32 local_4;
  
  do {
    if ((in_RDI->buffer_ < in_RDI->buffer_end_) &&
       (local_4 = (uint32)*in_RDI->buffer_, local_4 < 0x80)) {
      pCVar3 = in_RDI;
      io::CodedInputStream::Advance(in_RDI,1);
      value = (uint32)((ulong)pCVar3 >> 0x20);
    }
    else {
      pCVar3 = in_RDI;
      local_4 = io::CodedInputStream::ReadTagFallback(input,output._4_4_);
      value = (uint32)((ulong)pCVar3 >> 0x20);
    }
    in_RDI->last_tag_ = local_4;
    if (local_4 == 0) {
      return true;
    }
    WVar2 = GetTagWireType(local_4);
    if (WVar2 == WIRETYPE_END_GROUP) {
      io::CodedOutputStream::WriteVarint32((CodedOutputStream *)CONCAT44(local_4,4),value);
      return true;
    }
    bVar1 = SkipField(input,output._4_4_,_wire_type);
  } while (bVar1);
  return false;
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input,
                                 io::CodedOutputStream* output) {
  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      output->WriteVarint32(tag);
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, output)) return false;
  }
}